

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper.h
# Opt level: O3

void __thiscall spdlog::details::file_helper::~file_helper(file_helper *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  if ((FILE *)this->_fd != (FILE *)0x0) {
    fclose((FILE *)this->_fd);
    this->_fd = (FILE *)0x0;
  }
  pcVar1 = (this->_filename)._M_dataplus._M_p;
  paVar2 = &(this->_filename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~file_helper()
    {
        close();
    }